

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSerialize.cpp
# Opt level: O0

void __thiscall
TTD::TextFormatWriter::WriteNakedDouble(TextFormatWriter *this,double val,Separator separator)

{
  bool bVar1;
  BOOL BVar2;
  undefined8 in_RDX;
  undefined1 auVar3 [16];
  Separator separator_local;
  double val_local;
  TextFormatWriter *this_local;
  
  (*(this->super_FileWriter)._vptr_FileWriter[2])(this,(ulong)separator,in_RDX,separator);
  BVar2 = Js::JavascriptNumber::IsNan(val);
  if (BVar2 == 0) {
    bVar1 = Js::JavascriptNumber::IsPosInf(val);
    if (bVar1) {
      FileWriter::WriteRawCharBuff(&this->super_FileWriter,L"#+inf",5);
    }
    else {
      bVar1 = Js::JavascriptNumber::IsNegInf(val);
      if (bVar1) {
        FileWriter::WriteRawCharBuff(&this->super_FileWriter,L"#-inf",5);
      }
      else if ((Js::NumberConstants::MAX_VALUE != val) ||
              (NAN(Js::NumberConstants::MAX_VALUE) || NAN(val))) {
        if ((Js::NumberConstants::MIN_VALUE != val) ||
           (NAN(Js::NumberConstants::MIN_VALUE) || NAN(val))) {
          if ((val != 2.220446049250313e-16) || (NAN(val))) {
            if ((2147483647.0 <= val) && (val <= 2147483647.0)) {
              auVar3._8_8_ = 0;
              auVar3._0_8_ = val;
              auVar3 = roundsd(auVar3,auVar3,9);
              if ((auVar3._0_8_ == val) && (!NAN(auVar3._0_8_) && !NAN(val))) {
                FileWriter::WriteFormattedCharData<6ul,long>
                          (&this->super_FileWriter,(char16 (*) [6])0x18b5852,(long)val);
                return;
              }
            }
            FileWriter::WriteFormattedCharData<6ul,double>
                      (&this->super_FileWriter,(char16 (*) [6])L"%.32f",val);
          }
          else {
            FileWriter::WriteRawCharBuff(&this->super_FileWriter,L"#ep",3);
          }
        }
        else {
          FileWriter::WriteRawCharBuff(&this->super_FileWriter,L"#lb",3);
        }
      }
      else {
        FileWriter::WriteRawCharBuff(&this->super_FileWriter,L"#ub",3);
      }
    }
  }
  else {
    FileWriter::WriteRawCharBuff(&this->super_FileWriter,L"#nan",4);
  }
  return;
}

Assistant:

void TextFormatWriter::WriteNakedDouble(double val, NSTokens::Separator separator)
    {
        this->WriteSeparator(separator);

        if(Js::JavascriptNumber::IsNan(val))
        {
            this->WriteRawCharBuff(_u("#nan"), 4);
        }
        else if(Js::JavascriptNumber::IsPosInf(val))
        {
            this->WriteRawCharBuff(_u("#+inf"), 5);
        }
        else if(Js::JavascriptNumber::IsNegInf(val))
        {
            this->WriteRawCharBuff(_u("#-inf"), 5);
        }
        else if(Js::JavascriptNumber::MAX_VALUE == val)
        {
            this->WriteRawCharBuff(_u("#ub"), 3);
        }
        else if(Js::JavascriptNumber::MIN_VALUE == val)
        {
            this->WriteRawCharBuff(_u("#lb"), 3);
        }
        else if(Js::Math::EPSILON == val)
        {
            this->WriteRawCharBuff(_u("#ep"), 3);
        }
        else
        {
            if(INT32_MAX <= val && val <= INT32_MAX && floor(val) == val)
            {
                this->WriteFormattedCharData(_u("%I64i"), (int64)val);
            }
            else
            {
                //
                //TODO: this is nice for visual debugging but we inherently lose precision
                //      will want to change this to a dump of the bit representation of the number
                //

                this->WriteFormattedCharData(_u("%.32f"), val);
            }
        }
    }